

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

bool __thiscall
cfd::ConfidentialTransactionContext::IsFindTxOut
          (ConfidentialTransactionContext *this,Address *address,uint32_t *index,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indexes)

{
  byte bVar1;
  int iVar2;
  long in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  uint32_t *in_RSI;
  Script *in_RDI;
  CfdException *except;
  uint32_t temp_index;
  Script *in_stack_ffffffffffffff60;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (in_RCX == 0) {
    iVar2 = (*in_RDI->_vptr_Script[0x10])(in_RDI,in_RSI);
    if (in_RDX != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      *(int *)&(in_RDX->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start = iVar2;
    }
    bVar1 = 1;
  }
  else {
    cfd::core::Address::GetLockingScript();
    bVar1 = IsFindTxOut((ConfidentialTransactionContext *)
                        CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,in_RSI,
                        in_RDX);
    core::Script::~Script(in_stack_ffffffffffffff60);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ConfidentialTransactionContext::IsFindTxOut(
    const Address& address, uint32_t* index,
    std::vector<uint32_t>* indexes) const {
  if (indexes != nullptr) {
    return IsFindTxOut(address.GetLockingScript(), index, indexes);
  }
  try {
    uint32_t temp_index = GetTxOutIndex(address);
    if (index != nullptr) *index = temp_index;
    return true;
  } catch (const CfdException& except) {
    if (except.GetErrorCode() == CfdError::kCfdIllegalArgumentError) {
      return false;
    } else {
      throw except;
    }
  }
}